

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O0

bool __thiscall
ICM::Compiler::InstructionCreater::createNodeWhile
          (InstructionCreater *this,Node *node,Element *refelt)

{
  Element *this_00;
  JumpNot *this_01;
  Jump *this_02;
  size_t sVar1;
  Element EVar2;
  Jump *local_80;
  Jump *local_78;
  Jump *jmp;
  anon_union_4_2_4727c1b0_for_Element_0 local_68;
  undefined4 uStack_64;
  uint_t uStack_60;
  JumpNot *local_48;
  JumpNot *jpendinst;
  size_t Bid;
  Element *Rdo;
  Element *Bexp;
  Element *local_20;
  Element *refelt_local;
  Node *node_local;
  InstructionCreater *this_local;
  
  local_20 = refelt;
  refelt_local = (Element *)node;
  node_local = (Node *)this;
  Bexp = (Element *)ASTBase::Node::getIndex(node);
  std::stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>::push
            (&this->LoopBreakIDs,(value_type *)&Bexp);
  Rdo = std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>::operator[]
                  ((vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_> *)
                   refelt_local,1);
  Bid = (size_t)std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>::
                operator[]((vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_> *)
                           refelt_local,2);
  jpendinst = (JumpNot *)NextInstID(this);
  createReferNode(this,Rdo);
  this_01 = (JumpNot *)operator_new(0x28);
  *(undefined8 *)&this_01->Data = 0;
  (this_01->Data).index = 0;
  (this_01->super_InstDataBase<(ICM::Instruction::Instruction)32>).super_InstructionData.
  _vptr_InstructionData = (_func_int **)0x0;
  *(undefined8 *)
   &(this_01->super_InstDataBase<(ICM::Instruction::Instruction)32>).super_InstructionData.Inst = 0;
  this_01->Index = 0;
  Instruction::Insts::JumpNot::JumpNot(this_01);
  local_48 = this_01;
  EVar2 = Instruction::ConvertToInstElement(Rdo);
  uStack_60 = EVar2.index;
  local_68 = EVar2.field_0;
  *(ulong *)&local_48->Data = CONCAT44(uStack_64,local_68.type);
  (local_48->Data).index = uStack_60;
  jmp = (Jump *)local_48;
  std::
  vector<ICM::Instruction::InstructionData_*,_std::allocator<ICM::Instruction::InstructionData_*>_>
  ::push_back(&(this->InstList).
               super_vector<ICM::Instruction::InstructionData_*,_std::allocator<ICM::Instruction::InstructionData_*>_>
              ,(value_type *)&jmp);
  createReferNode(this,(Element *)Bid);
  this_02 = (Jump *)operator_new(0x18);
  (this_02->super_InstDataBase<(ICM::Instruction::Instruction)30>).super_InstructionData.
  _vptr_InstructionData = (_func_int **)0x0;
  *(undefined8 *)
   &(this_02->super_InstDataBase<(ICM::Instruction::Instruction)30>).super_InstructionData.Inst = 0;
  this_02->Index = 0;
  Instruction::Insts::Jump::Jump(this_02);
  this_02->Index = (size_t)jpendinst;
  local_80 = this_02;
  local_78 = this_02;
  std::
  vector<ICM::Instruction::InstructionData_*,_std::allocator<ICM::Instruction::InstructionData_*>_>
  ::push_back(&(this->InstList).
               super_vector<ICM::Instruction::InstructionData_*,_std::allocator<ICM::Instruction::InstructionData_*>_>
              ,(value_type *)&local_80);
  sVar1 = NextInstID(this);
  local_48->Index = sVar1;
  Instruction::InstructionList::push(&this->InstList,nop);
  this_00 = local_20;
  sVar1 = CurrInstID(this);
  ASTBase::Element::setRefer(this_00,sVar1);
  sVar1 = ASTBase::Element::getRefer(local_20);
  adjustLoopBreakJump(this,sVar1);
  std::stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>::pop
            (&this->LoopBreakIDs);
  return true;
}

Assistant:

bool createNodeWhile(Node &node, Element &refelt) {
				LoopBreakIDs.push(node.getIndex());
				Element &Bexp = node[1];
				Element &Rdo = node[2];
				size_t Bid = NextInstID();
				createReferNode(Bexp);
				auto *jpendinst = new Insts::JumpNot();
				jpendinst->Data = ConvertToInstElement(Bexp);
				InstList.push_back(jpendinst);
				createReferNode(Rdo);
				Insts::Jump *jmp = new Insts::Jump();
				jmp->Index = Bid;
				InstList.push_back(jmp);
				jpendinst->Index = NextInstID();
				InstList.push(nop);

				refelt.setRefer(CurrInstID());
				adjustLoopBreakJump(refelt.getRefer());
				LoopBreakIDs.pop();
				return true;
			}